

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdVerify(Kit_DsdNtk_t *pNtk,uint *pTruth,int nVars)

{
  long lVar1;
  long lVar2;
  Kit_DsdMan_t *p;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  
  p = Kit_DsdManAlloc(nVars,(uint)pNtk->nVars + (uint)pNtk->nNodes + 2);
  puVar3 = Kit_DsdTruthCompute(p,pNtk);
  uVar5 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar5 = 1;
  }
  do {
    iVar4 = (int)uVar5;
    if (iVar4 < 1) goto LAB_005c84cf;
    lVar1 = uVar5 - 1;
    lVar2 = uVar5 - 1;
    uVar5 = uVar5 - 1;
  } while (pTruth[lVar1] == puVar3[lVar2]);
  if (0 < iVar4) {
    puts("Verification failed.");
  }
LAB_005c84cf:
  Kit_DsdManFree(p);
  return;
}

Assistant:

void Kit_DsdVerify( Kit_DsdNtk_t * pNtk, unsigned * pTruth, int nVars )
{
    Kit_DsdMan_t * p;
    unsigned * pTruthC;
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk)+2 );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
    if ( !Extra_TruthIsEqual( pTruth, pTruthC, nVars ) )
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );
}